

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void glist_readfrombinbuf(_glist *x,_binbuf *b,char *filename,int selectem)

{
  t_atom *ptVar1;
  t_atom *ptVar2;
  word wVar3;
  undefined4 uVar4;
  int natoms;
  int iVar5;
  int message_00;
  int iVar6;
  _glist *in_RAX;
  t_atom *vec;
  t_atom *argv;
  t_template *x1;
  t_template *x2;
  char *in_R8;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int message;
  int nextmsg;
  t_symbol *local_50;
  int local_48;
  int local_44;
  _glist *local_40;
  word *local_38;
  
  glist_getcanvas(in_RAX);
  nextmsg = 0;
  natoms = binbuf_getnatom(b);
  vec = binbuf_getvec(b);
  iVar5 = canvas_scanbinbuf(natoms,vec,&message,&nextmsg);
  if (((iVar5 != 1) && (vec[message].a_type != A_SYMBOL)) &&
     (iVar5 = strcmp((vec[message].a_w.w_symbol)->s_name,"data"), iVar5 != 0)) {
    pd_error(x,"%s: file apparently of wrong type",filename);
    return;
  }
  local_38 = &vec[1].a_w;
  local_48 = selectem;
  local_40 = x;
  do {
    iVar6 = local_48;
    argv = (t_atom *)getbytes(0);
    message_00 = canvas_scanbinbuf(natoms,vec,&message,&nextmsg);
    iVar5 = message;
    if (message_00 < 2) {
      freebytes(argv,0);
      break;
    }
    lVar7 = (long)message;
    local_44 = message_00;
    if (message_00 == 2) {
      if (vec[lVar7].a_type == A_SYMBOL) {
        iVar6 = strcmp((vec[lVar7].a_w.w_symbol)->s_name,"template");
        if ((iVar6 == 0) && (vec[lVar7 + 1].a_type == A_SYMBOL)) goto LAB_0014c34d;
      }
      canvas_readerror((int)vec,(t_atom *)(ulong)(uint)iVar5,2,0x1a80c4,in_R8);
    }
    else {
      canvas_readerror((int)vec,(t_atom *)(ulong)(uint)message,message_00,0x1a80b0,in_R8);
LAB_0014c34d:
      local_50 = canvas_makebindsym(local_38[lVar7 * 2].w_symbol);
      uVar9 = 0;
      while( true ) {
        uVar8 = uVar9;
        iVar5 = canvas_scanbinbuf(natoms,vec,&message,&nextmsg);
        if (iVar5 - 4U < 0xfffffffe) break;
        uVar9 = (ulong)(uint)((int)uVar8 + iVar5);
        argv = (t_atom *)resizebytes(argv,uVar8 * 0x10,uVar9 << 4);
        lVar7 = (long)message;
        ptVar1 = vec + lVar7;
        uVar4 = *(undefined4 *)&ptVar1->field_0x4;
        wVar3 = ptVar1->a_w;
        ptVar2 = argv + uVar8;
        ptVar2->a_type = ptVar1->a_type;
        *(undefined4 *)&ptVar2->field_0x4 = uVar4;
        ptVar2->a_w = wVar3;
        ptVar1 = vec + lVar7 + 1;
        uVar4 = *(undefined4 *)&ptVar1->field_0x4;
        wVar3 = ptVar1->a_w;
        ptVar2 = argv + uVar8 + 1;
        ptVar2->a_type = ptVar1->a_type;
        *(undefined4 *)&ptVar2->field_0x4 = uVar4;
        ptVar2->a_w = wVar3;
        if (iVar5 == 3) {
          uVar4 = *(undefined4 *)&vec[lVar7 + 2].field_0x4;
          wVar3 = vec[lVar7 + 2].a_w;
          argv[uVar8 + 2].a_type = vec[lVar7 + 2].a_type;
          *(undefined4 *)&argv[uVar8 + 2].field_0x4 = uVar4;
          argv[uVar8 + 2].a_w = wVar3;
        }
      }
      x1 = template_findbyname(local_50);
      if (x1 == (t_template *)0x0) {
        pd_error((void *)0x0,"%s: template not found in current patch",local_50->s_name);
        freebytes(argv,uVar8 << 4);
        return;
      }
      x2 = template_new(local_50,(int)uVar8,argv);
      freebytes(argv,uVar8 << 4);
      iVar5 = template_match(x1,x2);
      if (iVar5 == 0) {
        pd_error((void *)0x0,"%s: template doesn\'t match current one",local_50->s_name);
        pd_free(&x2->t_pdobj);
        return;
      }
      pd_free(&x2->t_pdobj);
      x = local_40;
    }
    iVar6 = local_48;
  } while (1 < local_44);
  while (nextmsg < natoms) {
    canvas_readscalar(x,natoms,vec,&nextmsg,iVar6);
  }
  return;
}

Assistant:

void glist_readfrombinbuf(t_glist *x, const t_binbuf *b, const char *filename, int selectem)
{
    t_canvas *canvas = glist_getcanvas(x);
    int natoms, nline, message, nextmsg = 0;
    t_atom *vec;

    natoms = binbuf_getnatom(b);
    vec = binbuf_getvec(b);


            /* check for file type */
    nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
    if (nline != 1 && vec[message].a_type != A_SYMBOL &&
        strcmp(vec[message].a_w.w_symbol->s_name, "data"))
    {
        pd_error(x, "%s: file apparently of wrong type", filename);
        return;
    }
        /* read in templates and check for consistency */
    while (1)
    {
        t_template *newtemplate, *existtemplate;
        t_symbol *templatesym;
        t_atom *templateargs = getbytes(0);
        int ntemplateargs = 0, newnargs;
        nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
        if (nline < 2)
        {
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            break;
        }
        else if (nline > 2)
            canvas_readerror(natoms, vec, message, nline,
                "extra items ignored");
        else if (vec[message].a_type != A_SYMBOL ||
            strcmp(vec[message].a_w.w_symbol->s_name, "template") ||
            vec[message + 1].a_type != A_SYMBOL)
        {
            canvas_readerror(natoms, vec, message, nline,
                "bad template header");
            continue;
        }
        templatesym = canvas_makebindsym(vec[message + 1].a_w.w_symbol);
        while (1)
        {
            nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
            if (nline != 2 && nline != 3)
                break;
            newnargs = ntemplateargs + nline;
            templateargs = (t_atom *)t_resizebytes(templateargs,
                sizeof(*templateargs) * ntemplateargs,
                sizeof(*templateargs) * newnargs);
            templateargs[ntemplateargs] = vec[message];
            templateargs[ntemplateargs + 1] = vec[message + 1];
            if (nline == 3)
                templateargs[ntemplateargs + 2] = vec[message + 2];
            ntemplateargs = newnargs;
        }
        if (!(existtemplate = template_findbyname(templatesym)))
        {
            pd_error(0, "%s: template not found in current patch",
                templatesym->s_name);
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            return;
        }
        newtemplate = template_new(templatesym, ntemplateargs, templateargs);
        t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
        if (!template_match(existtemplate, newtemplate))
        {
            pd_error(0, "%s: template doesn't match current one",
                templatesym->s_name);
            pd_free(&newtemplate->t_pdobj);
            return;
        }
        pd_free(&newtemplate->t_pdobj);
    }
    while (nextmsg < natoms)
    {
        canvas_readscalar(x, natoms, vec, &nextmsg, selectem);
    }
}